

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

void register_backpressure_callback
               (CManager_conflict cm,EVstone s,EVSubmitCallbackFunc cb,void *user_data)

{
  int iVar1;
  stall_callback *psVar2;
  stone_type p_Var3;
  
  psVar2 = (stall_callback *)INT_CMmalloc(0x20);
  p_Var3 = stone_struct(cm->evp,s);
  iVar1 = CManager_locked(cm);
  if (iVar1 != 0) {
    psVar2->cb = cb;
    psVar2->user_data = user_data;
    psVar2->next = p_Var3->unstall_callbacks;
    p_Var3->unstall_callbacks = psVar2;
    return;
  }
  __assert_fail("CManager_locked(cm)",
                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                ,0xb67,
                "void register_backpressure_callback(CManager, EVstone, EVSubmitCallbackFunc, void *)"
               );
}

Assistant:

static void
register_backpressure_callback(CManager cm, EVstone s, EVSubmitCallbackFunc cb, void *user_data) {
    stall_callback *new_cb = INT_CMmalloc(sizeof(stall_callback));
    stone_type stone = stone_struct(cm->evp, s);
    assert(CManager_locked(cm));
    new_cb->cb = cb;
    new_cb->user_data = user_data;
    new_cb->next = stone->unstall_callbacks;
    stone->unstall_callbacks = new_cb;
}